

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity.c
# Opt level: O0

void unittest_scan(char *folder_path,unittest_data *data)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  gravity_compiler_t *compiler_00;
  gravity_closure_t *closure_00;
  gravity_vm *vm_00;
  gravity_value_t v1;
  gravity_value_t result;
  gravity_vm *vm;
  gravity_closure_t *closure;
  gravity_compiler_t *compiler;
  gravity_delegate_t delegate;
  char *source_code;
  size_t size;
  char *full_path;
  char *target_file;
  char *outbuffer;
  DIR *dir;
  unittest_data *data_local;
  char *folder_path_local;
  
  dir = (DIR *)data;
  data_local = (unittest_data *)folder_path;
  outbuffer = (char *)directory_init(folder_path);
  if ((DIR *)outbuffer != (DIR *)0x0) {
    target_file = (char *)0x0;
    while (full_path = directory_read((DIR *)outbuffer,target_file), full_path != (char *)0x0) {
      size = (size_t)file_buildpath(full_path,&data_local->processed);
      _Var1 = is_directory((char *)size);
      if (_Var1) {
        iVar2 = strcmp(full_path,"disabled");
        if (iVar2 != 0) {
          unittest_scan((char *)size,(unittest_data *)dir);
        }
      }
      else {
        pcVar3 = strstr((char *)size,".gravity");
        if (pcVar3 != (char *)0x0) {
          pcVar3 = strstr((char *)size,"/fuzzy/");
          dir[1] = (DIR)(pcVar3 != (char *)0x0);
          source_code = (char *)0x0;
          delegate.bridge_free = (gravity_bridge_free)file_read((char *)size,(size_t *)&source_code)
          ;
          if (delegate.bridge_free == (gravity_bridge_free)0x0) {
            __assert_fail("source_code",
                          "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/cli/gravity.c"
                          ,0xc6,"void unittest_scan(const char *, unittest_data *)");
          }
          unittest_init(full_path,(unittest_data *)dir);
          printf("\n%d\tTest file: %s\n",(ulong)*(uint *)(dir + 4),full_path);
          printf("\tTest path: %s\n");
          free((void *)size);
          memset(&compiler,0,0xc0);
          compiler = (gravity_compiler_t *)dir;
          delegate.log_clear = unittest_error;
          delegate.error_callback = unittest_callback;
          delegate.precode_callback = unittest_read;
          compiler_00 = gravity_compiler_create((gravity_delegate_t *)&compiler);
          closure_00 = gravity_compiler_run
                                 (compiler_00,(char *)delegate.bridge_free,(size_t)source_code,0,
                                  false,false);
          vm_00 = gravity_vm_new((gravity_delegate_t *)&compiler);
          gravity_compiler_transfer(compiler_00,vm_00);
          gravity_compiler_free(compiler_00);
          if ((closure_00 != (gravity_closure_t *)0x0) &&
             (_Var1 = gravity_vm_runmain(vm_00,closure_00), _Var1)) {
            *dir = (DIR)0x1;
            v1 = gravity_vm_result(vm_00);
            if ((((byte)dir[1] & 1) != 0) ||
               (_Var1 = gravity_value_equals(v1,*(gravity_value_t *)(dir + 0x18)), _Var1)) {
              *(int *)(dir + 8) = *(int *)(dir + 8) + 1;
              printf("\tSUCCESS\n");
            }
            else {
              *(int *)(dir + 0xc) = *(int *)(dir + 0xc) + 1;
              printf("\tFAILURE\n");
            }
            gravity_value_free((gravity_vm *)0x0,*(gravity_value_t *)(dir + 0x18));
          }
          gravity_vm_free(vm_00);
          if (((byte)*dir & 1) == 0) {
            *(int *)(dir + 8) = *(int *)(dir + 8) + 1;
            printf("\tSUCCESS\n");
          }
          unittest_cleanup(full_path,(unittest_data *)dir);
        }
      }
    }
  }
  return;
}

Assistant:

static void unittest_scan (const char *folder_path, unittest_data *data) {
    DIRREF dir = directory_init(folder_path);
    if (!dir) return;
    #ifdef WIN32
    char outbuffer[MAX_PATH];
    #else
    char *outbuffer = NULL;
    #endif
    const char *target_file;
    while ((target_file = directory_read(dir, outbuffer))) {
        
        // if file is a folder then start recursion
        const char *full_path = file_buildpath(target_file, folder_path);
        if (is_directory(full_path)) {
            // skip disabled folder
            if (strcmp(target_file, "disabled") == 0) continue;
            unittest_scan(full_path, data);
            continue;
        }
        
        // test only files with a .gravity extension
        if (strstr(full_path, ".gravity") == NULL) continue;
        data->is_fuzzy = (strstr(full_path, "/fuzzy/") != NULL);
        
        // load source code
        size_t size = 0;
        const char *source_code = file_read(full_path, &size);
        assert(source_code);
        
        // start unit test
        unittest_init(target_file, data);
        
        // compile and run source code
        printf("\n%d\tTest file: %s\n", data->ncount, target_file);
        printf("\tTest path: %s\n", full_path);
        mem_free(full_path);
        
        // initialize compiler and delegates
        gravity_delegate_t delegate = {
            .xdata = (void *)data,
            .error_callback = unittest_error,
            .unittest_callback = unittest_callback,
            .loadfile_callback = unittest_read
        };
        
        gravity_compiler_t *compiler = gravity_compiler_create(&delegate);
        gravity_closure_t *closure = gravity_compiler_run(compiler, source_code, size, 0, false, false);
        gravity_vm *vm = gravity_vm_new(&delegate);
        gravity_compiler_transfer(compiler, vm);
        gravity_compiler_free(compiler);
        
        if (closure) {
            if (gravity_vm_runmain(vm, closure)) {
                data->processed = true;
                gravity_value_t result = gravity_vm_result(vm);
                if (data->is_fuzzy || gravity_value_equals(result, data->expected_value)) {
                    ++data->nsuccess;
                    printf("\tSUCCESS\n");
                } else {
                    ++data->nfailure;
                    printf("\tFAILURE\n");
                }
                gravity_value_free(NULL, data->expected_value);
            }
        }
        gravity_vm_free(vm);
        
        // case for empty files or simple declarations test
        if (!data->processed) {
            ++data->nsuccess;
            printf("\tSUCCESS\n");
        }
        
        // cleanup unitest
        unittest_cleanup(target_file, data);
    }
}